

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::PatchInitValueCheckLayout<Js::PolymorphicInlineCache>
               (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,RecyclableObject *object,PropertyId propertyId,
               Var newValue)

{
  bool bVar1;
  DynamicObject *pDVar2;
  undefined1 local_49;
  undefined8 local_48;
  DynamicTypeHandler *oldTypeHandler;
  Var newValue_local;
  PropertyId propertyId_local;
  RecyclableObject *object_local;
  InlineCacheIndex inlineCacheIndex_local;
  PolymorphicInlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  bVar1 = VarIs<Js::DynamicObject,Js::RecyclableObject>(object);
  if (bVar1) {
    pDVar2 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(object);
    local_48 = DynamicObject::GetTypeHandler(pDVar2);
  }
  else {
    local_48 = (DynamicTypeHandler *)0x0;
  }
  PatchInitValue<true,Js::PolymorphicInlineCache>
            (functionBody,inlineCache,inlineCacheIndex,object,propertyId,newValue);
  local_49 = false;
  if (local_48 != (DynamicTypeHandler *)0x0) {
    pDVar2 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(object);
    local_49 = LayoutChanged(pDVar2,local_48);
  }
  return local_49;
}

Assistant:

inline bool JavascriptOperators::PatchInitValueCheckLayout(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, RecyclableObject* object, PropertyId propertyId, Var newValue)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchInitValueCheckLayout);
        JIT_HELPER_SAME_ATTRIBUTES(Op_PatchInitValueCheckLayout, Op_PatchInitValue);

        DynamicTypeHandler * oldTypeHandler = VarIs<DynamicObject>(object) ? UnsafeVarTo<DynamicObject>(object)->GetTypeHandler() : nullptr;
        PatchInitValue<true, TInlineCache>(functionBody, inlineCache, inlineCacheIndex, object, propertyId, newValue);
        return (oldTypeHandler != nullptr && LayoutChanged(UnsafeVarTo<DynamicObject>(object), oldTypeHandler));

        JIT_HELPER_END(Op_PatchInitValueCheckLayout);
    }